

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

VariableSymbol *
slang::ast::VariableSymbol::fromSyntax
          (Compilation *compilation,ForVariableDeclarationSyntax *syntax,VariableSymbol *lastVar)

{
  undefined1 *puVar1;
  DeclaratorSyntax *pDVar2;
  VariableSymbol *this;
  Token nameToken;
  VariableLifetime local_54;
  SourceLocation local_50;
  Token local_48;
  string_view local_38;
  
  pDVar2 = (syntax->declarator).ptr;
  local_48.kind = (pDVar2->name).kind;
  local_48._2_1_ = (pDVar2->name).field_0x2;
  local_48.numFlags.raw = (pDVar2->name).numFlags.raw;
  local_48.rawLen = (pDVar2->name).rawLen;
  local_48.info = (pDVar2->name).info;
  local_38 = parsing::Token::valueText(&local_48);
  local_50 = parsing::Token::location(&local_48);
  local_54 = Automatic;
  this = BumpAllocator::
         emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                   (&compilation->super_BumpAllocator,&local_38,&local_50,&local_54);
  if (syntax->type == (DataTypeSyntax *)0x0) {
    DeclaredType::setLink
              (&(this->super_ValueSymbol).declaredType,&(lastVar->super_ValueSymbol).declaredType);
  }
  else {
    (this->super_ValueSymbol).declaredType.typeOrLink.typeSyntax = syntax->type;
    puVar1 = &(this->super_ValueSymbol).declaredType.field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
  }
  ValueSymbol::setFromDeclarator(&this->super_ValueSymbol,(syntax->declarator).ptr);
  return this;
}

Assistant:

VariableSymbol& VariableSymbol::fromSyntax(Compilation& compilation,
                                           const ForVariableDeclarationSyntax& syntax,
                                           const VariableSymbol* lastVar) {
    auto nameToken = syntax.declarator->name;
    auto var = compilation.emplace<VariableSymbol>(nameToken.valueText(), nameToken.location(),
                                                   VariableLifetime::Automatic);

    if (syntax.type)
        var->setDeclaredType(*syntax.type);
    else {
        SLANG_ASSERT(lastVar);
        var->getDeclaredType()->setLink(*lastVar->getDeclaredType());
    }

    var->setFromDeclarator(*syntax.declarator);
    return *var;
}